

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ConditionalStatement *stmt)

{
  size_t sVar1;
  pointer pCVar2;
  bool bVar3;
  Statement *pSVar4;
  long lVar5;
  ConstantValue result;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  if (this->setupMode == true) {
    Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifTrue,this);
    if (stmt->ifFalse != (Statement *)0x0) {
      Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifFalse,this);
      return;
    }
  }
  else {
    sVar1 = (stmt->conditions)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      pCVar2 = (stmt->conditions)._M_ptr;
      lVar5 = 0;
      do {
        if (*(long *)((long)&pCVar2->pattern + lVar5) != 0) {
LAB_004bfe6d:
          Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifTrue,this);
          pSVar4 = stmt->ifFalse;
          if (pSVar4 == (Statement *)0x0) {
            return;
          }
          goto LAB_004bfe87;
        }
        if ((this->anyErrors != false) ||
           (bVar3 = EvalContext::step(&this->evalCtx,(SourceLocation)0xffffffffffffffff), !bVar3)) {
          this->anyErrors = true;
          goto LAB_004bfe6d;
        }
        Expression::eval((ConstantValue *)&local_58,
                         *(Expression **)((long)&(pCVar2->expr).ptr + lVar5),&this->evalCtx);
        if (local_58._M_index == '\0') {
          Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifTrue,this);
          pSVar4 = stmt->ifFalse;
LAB_004bfeb1:
          if (pSVar4 != (Statement *)0x0) {
            Statement::visit<slang::ast::UnrollVisitor&>(pSVar4,this);
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_58);
          return;
        }
        bVar3 = ConstantValue::isTrue((ConstantValue *)&local_58);
        if (!bVar3) {
          pSVar4 = stmt->ifFalse;
          goto LAB_004bfeb1;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        lVar5 = lVar5 + 0x10;
      } while (sVar1 << 4 != lVar5);
    }
    pSVar4 = stmt->ifTrue;
LAB_004bfe87:
    Statement::visit<slang::ast::UnrollVisitor&>(pSVar4,this);
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& stmt) {
        // Evaluate the condition; if not constant visit both sides,
        // otherwise visit only the side that matches the condition.
        auto fallback = [&] {
            stmt.ifTrue.visit(*this);
            if (stmt.ifFalse)
                stmt.ifFalse->visit(*this);
        };

        if (setupMode) {
            fallback();
            return;
        }

        for (auto& cond : stmt.conditions) {
            if (cond.pattern || !step()) {
                fallback();
                return;
            }

            auto result = cond.expr->eval(evalCtx);
            if (!result) {
                fallback();
                return;
            }

            if (!result.isTrue()) {
                if (stmt.ifFalse)
                    stmt.ifFalse->visit(*this);
                return;
            }
        }

        stmt.ifTrue.visit(*this);
    }